

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O1

bool google::protobuf::util::SerializeDelimitedToZeroCopyStream
               (MessageLite *message,ZeroCopyOutputStream *output)

{
  uint8_t *puVar1;
  ZeroCopyOutputStream **ppZVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  uint8_t *ptr;
  int size;
  void *data;
  CodedOutputStream coded_output;
  uint local_74;
  EpsCopyOutputStream *local_70;
  CodedOutputStream local_68;
  
  local_68.impl_.is_serialization_deterministic_ =
       (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  puVar1 = local_68.impl_.buffer_;
  local_68.impl_.had_error_ = false;
  local_68.impl_.aliasing_enabled_ = false;
  local_68.impl_.skip_check_consistency = false;
  local_68.impl_.end_ = puVar1;
  local_68.impl_.buffer_end_ = puVar1;
  local_68.impl_.stream_ = output;
  local_68.cur_ = puVar1;
  iVar4 = (*output->_vptr_ZeroCopyOutputStream[4])(output);
  local_68.start_count_ = CONCAT44(extraout_var,iVar4);
  iVar4 = (*output->_vptr_ZeroCopyOutputStream[2])(output,&local_70,&local_74);
  if (((char)iVar4 != '\0') && (0 < (int)local_74)) {
    ppZVar2 = &local_70[-1].stream_;
    if ((int)local_74 < 0x11) {
      ppZVar2 = (ZeroCopyOutputStream **)puVar1;
    }
    local_68.impl_.end_ = (uint8_t *)((long)ppZVar2 + (ulong)local_74);
    local_68.impl_.buffer_end_ = (uint8_t *)local_70;
    local_68.cur_ = puVar1;
    if (0x10 < (int)local_74) {
      local_68.impl_.buffer_end_ = (uint8_t *)(EpsCopyOutputStream *)0x0;
      local_68.cur_ = (uint8_t *)local_70;
    }
  }
  bVar3 = SerializeDelimitedToCodedStream(message,&local_68);
  io::CodedOutputStream::~CodedOutputStream(&local_68);
  return bVar3;
}

Assistant:

bool SerializeDelimitedToZeroCopyStream(const MessageLite& message,
                                        io::ZeroCopyOutputStream* output) {
  io::CodedOutputStream coded_output(output);
  return SerializeDelimitedToCodedStream(message, &coded_output);
}